

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

uint8_t string_to_bcd_a(char *number_string,uint8_t *buffer,uint8_t buff_len)

{
  char cVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  byte bVar3;
  ulong uVar4;
  ulong __maxlen;
  
  bVar3 = 0;
  memset(buffer,0,CONCAT71(in_register_00000011,buff_len) & 0xffffffff);
  __maxlen = (ulong)((int)CONCAT71(in_register_00000011,buff_len) * 2 & 0xff);
  sVar2 = strnlen(number_string,__maxlen);
  if (sVar2 != 0) {
    uVar4 = 0;
    bVar3 = 0;
    do {
      cVar1 = number_string[uVar4];
      if ((bVar3 & 1) == 0) {
        if (cVar1 == '0') {
          buffer[bVar3 >> 1] = 0xa0;
        }
        else {
          buffer[bVar3 >> 1] = cVar1 << 4;
        }
      }
      else if (cVar1 == '0') {
        buffer[bVar3 >> 1] = buffer[bVar3 >> 1] | 10;
      }
      else {
        buffer[bVar3 >> 1] = buffer[bVar3 >> 1] | cVar1 - 0x30U;
      }
      bVar3 = bVar3 + 1;
      uVar4 = (ulong)bVar3;
      sVar2 = strnlen(number_string,__maxlen);
    } while (uVar4 < sVar2);
  }
  return bVar3;
}

Assistant:

extern uint8_t string_to_bcd_a(char *number_string, uint8_t *buffer, uint8_t buff_len) {
    uint8_t i;

    memset(buffer, 0, buff_len);

    for (i = 0; i < (strnlen(number_string, (uint8_t)(buff_len * 2))); i++) {
        if (i % 2 == 0) {
            if (number_string[i] == '0') {
                buffer[(i >> 1)] = 0xa0;
            } else {
                buffer[(i >> 1)] = (number_string[i] - '0') << 4;
            }
        } else {
            if (number_string[i] == '0') {
                buffer[(i >> 1)] |= 0x0a;
            } else {
                buffer[(i >> 1)] |= (number_string[i] - '0');
            }
        }
    }

    return i;
}